

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O3

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)0>::butterfly_radix8<2048l>
          (fft<float,_2048L,_(re::fft::direction)0> *this,span<std::complex<float>,_2048L> out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _ComplexT _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  lVar6 = 6;
  lVar7 = 5;
  lVar8 = 0x38;
  lVar9 = 0;
  do {
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x808 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[4]._M_value + lVar9 * 4);
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar30 = (float)uVar1;
    fVar29 = (float)uVar2;
    fVar11 = (float)((ulong)uVar2 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar9) =
         CONCAT44(fVar30 * fVar11 + fVar29 * fVar10,fVar30 * fVar29 + fVar11 * -fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x1008 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[2]._M_value + lVar9 * 2);
    fVar29 = (float)((ulong)uVar1 >> 0x20);
    fVar30 = (float)uVar1;
    fVar11 = (float)uVar2;
    fVar15 = (float)((ulong)uVar2 >> 0x20);
    fVar10 = fVar30 * fVar11 + fVar15 * -fVar29;
    fVar11 = fVar30 * fVar15 + fVar11 * fVar29;
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar9) = CONCAT44(fVar11,fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x1808 + lVar9);
    _Var3 = (this->twiddles)._M_elems[lVar6]._M_value;
    fVar15 = (float)uVar1;
    fVar12 = (float)((ulong)uVar1 >> 0x20);
    fVar30 = (float)_Var3;
    fVar29 = (float)(_Var3 >> 0x20);
    fVar23 = fVar15 * fVar30 + fVar29 * -fVar12;
    fVar24 = fVar15 * fVar29 + fVar30 * fVar12;
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar9) = CONCAT44(fVar24,fVar23);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x2008 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[1]._M_value + lVar9);
    fVar15 = (float)uVar1;
    fVar12 = (float)((ulong)uVar1 >> 0x20);
    fVar30 = (float)uVar2;
    fVar29 = (float)((ulong)uVar2 >> 0x20);
    fVar14 = fVar15 * fVar30 + fVar29 * -fVar12;
    fVar16 = fVar15 * fVar29 + fVar30 * fVar12;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar9) = CONCAT44(fVar16,fVar14);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x2808 + lVar9);
    _Var3 = (this->twiddles)._M_elems[lVar7]._M_value;
    fVar15 = (float)uVar1;
    fVar12 = (float)((ulong)uVar1 >> 0x20);
    fVar30 = (float)_Var3;
    fVar29 = (float)(_Var3 >> 0x20);
    fVar27 = fVar15 * fVar30 + fVar29 * -fVar12;
    fVar28 = fVar15 * fVar29 + fVar30 * fVar12;
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) = CONCAT44(fVar28,fVar27);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x3008 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[0]._M_value + lVar6 * 4);
    fVar15 = (float)uVar1;
    fVar12 = (float)((ulong)uVar1 >> 0x20);
    fVar30 = (float)uVar2;
    fVar29 = (float)((ulong)uVar2 >> 0x20);
    fVar19 = fVar15 * fVar30 + fVar29 * -fVar12;
    fVar20 = fVar15 * fVar29 + fVar30 * fVar12;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar9) = CONCAT44(fVar20,fVar19);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x3808 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[0]._M_value + lVar8);
    uVar4 = *(undefined8 *)((long)out.storage_.data_ + 8 + lVar9);
    uVar5 = *(undefined8 *)((long)out.storage_.data_ + 0x808 + lVar9);
    fVar12 = (float)uVar4;
    fVar13 = (float)((ulong)uVar4 >> 0x20);
    fVar30 = (float)uVar5;
    fVar17 = fVar12 + fVar30;
    fVar29 = (float)((ulong)uVar5 >> 0x20);
    fVar18 = fVar13 + fVar29;
    fVar12 = fVar12 - fVar30;
    fVar13 = fVar13 - fVar29;
    *(ulong *)((long)out.storage_.data_ + 8 + lVar9) = CONCAT44(fVar18,fVar17);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar9) = CONCAT44(fVar13,fVar12);
    fVar25 = fVar10 + fVar23;
    fVar26 = fVar11 + fVar24;
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar9) = CONCAT44(fVar26,fVar25);
    fVar21 = fVar14 + fVar27;
    fVar22 = fVar16 + fVar28;
    fVar14 = fVar14 - fVar27;
    fVar16 = fVar16 - fVar28;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar9) = CONCAT44(fVar22,fVar21);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) = CONCAT44(fVar16,fVar14);
    fVar30 = (float)uVar1;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    fVar27 = (float)uVar2;
    fVar28 = (float)((ulong)uVar2 >> 0x20);
    fVar29 = fVar30 * fVar27 + fVar28 * -fVar15;
    fVar30 = fVar30 * fVar28 + fVar27 * fVar15;
    fVar27 = fVar19 + fVar29;
    fVar28 = fVar20 + fVar30;
    fVar19 = fVar19 - fVar29;
    fVar20 = fVar20 - fVar30;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar9) = CONCAT44(fVar28,fVar27);
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar9) = CONCAT44(fVar20,fVar19);
    fVar10 = fVar10 - fVar23;
    fVar11 = fVar11 - fVar24;
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar9) =
         CONCAT44(fVar10,fVar11) ^ 0x8000000000000000;
    _Var3 = (this->twiddles)._M_elems[0x100]._M_value;
    fVar30 = (float)_Var3;
    fVar15 = (float)(_Var3 >> 0x20);
    fVar29 = fVar15 * -fVar16 + fVar14 * fVar30;
    fVar30 = fVar30 * fVar16 + fVar14 * fVar15;
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) = CONCAT44(fVar30,fVar29);
    _Var3 = (this->twiddles)._M_elems[0x100]._M_value;
    fVar15 = (float)_Var3;
    fVar14 = (float)(_Var3 >> 0x20);
    fVar16 = fVar19 * fVar14 + fVar20 * fVar15;
    fVar19 = fVar19 * fVar15 + -fVar20 * fVar14;
    fVar15 = fVar29 + fVar16;
    fVar14 = fVar30 + fVar19;
    fVar29 = fVar29 - fVar16;
    fVar30 = fVar30 - fVar19;
    *(ulong *)((long)out.storage_.data_ + 8 + lVar9) =
         CONCAT44(fVar18 + fVar26 + fVar22 + fVar28,fVar17 + fVar25 + fVar21 + fVar27);
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar9) =
         CONCAT44((fVar18 + fVar26) - (fVar22 + fVar28),(fVar17 + fVar25) - (fVar21 + fVar27));
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar9) =
         CONCAT44((fVar13 - fVar10) + fVar30,fVar12 + fVar11 + fVar15);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) =
         CONCAT44((fVar13 - fVar10) - fVar30,(fVar12 + fVar11) - fVar15);
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar9) =
         CONCAT44((fVar18 - fVar26) - (fVar21 - fVar27),(fVar17 - fVar25) + (fVar22 - fVar28));
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar9) =
         CONCAT44((fVar18 - fVar26) + (fVar21 - fVar27),(fVar17 - fVar25) - (fVar22 - fVar28));
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar9) =
         CONCAT44((fVar13 + fVar10) - fVar29,(fVar12 - fVar11) + fVar14);
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar9) =
         CONCAT44(fVar29 + fVar13 + fVar10,(fVar12 - fVar11) - fVar14);
    lVar6 = lVar6 + 6;
    lVar7 = lVar7 + 5;
    lVar8 = lVar8 + 0x38;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x7f8);
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }